

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarReader.cpp
# Opt level: O0

int ZXing::OneD::ParseFinderPattern(PatternView *view,bool reversed)

{
  array<ZXing::FixedPattern<5,_15,_false>,_10UL> l2rPattern;
  array<ZXing::FixedPattern<5,_15,_false>,_10UL> r2lPattern;
  byte bVar1;
  int iVar2;
  byte in_SIL;
  undefined8 in_RDI;
  undefined4 in_stack_fffffffffffffeac;
  undefined1 in_stack_ffffffffffffff14 [11];
  undefined8 in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 uStack_a4;
  undefined8 uStack_a0;
  undefined4 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined4 local_78;
  undefined1 local_70 [55];
  bool bStack_39;
  PatternView *pPStack_38;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined8 uStack_18;
  undefined4 local_10;
  byte local_9;
  
  bVar1 = in_SIL & 1;
  local_9 = bVar1;
  memcpy(local_70,&ParseFinderPattern::FINDER_PATTERNS,100);
  memcpy(&stack0xffffffffffffff28,&ParseFinderPattern::REVERSED_FINDER_PATTERNS,100);
  l2rPattern._M_elems[8]._data._4_4_ = uStack_a4;
  l2rPattern._M_elems[8]._data[0] = (short)in_stack_ffffffffffffff58;
  l2rPattern._M_elems[8]._data[1] = (short)((uint)in_stack_ffffffffffffff58 >> 0x10);
  l2rPattern._M_elems[0]._data[4] = (undefined2)local_20;
  l2rPattern._M_elems[1]._data[0] = local_20._2_2_;
  l2rPattern._M_elems[1]._data[1] = local_20._4_2_;
  l2rPattern._M_elems[1]._data[2] = local_20._6_2_;
  l2rPattern._M_elems[0]._data[0] = (undefined2)uStack_28;
  l2rPattern._M_elems[0]._data[1] = uStack_28._2_2_;
  l2rPattern._M_elems[0]._data[2] = uStack_28._4_2_;
  l2rPattern._M_elems[0]._data[3] = uStack_28._6_2_;
  l2rPattern._M_elems[1]._data[3] = (undefined2)uStack_18;
  l2rPattern._M_elems[1]._data[4] = uStack_18._2_2_;
  l2rPattern._M_elems[2]._data[0] = uStack_18._4_2_;
  l2rPattern._M_elems[2]._data[1] = uStack_18._6_2_;
  l2rPattern._M_elems[2]._data[2] = (undefined2)local_10;
  l2rPattern._M_elems[2]._data[3] = local_10._2_2_;
  l2rPattern._M_elems[2]._data[4] = (short)in_stack_fffffffffffffeac;
  l2rPattern._M_elems[3]._data[0] = (short)((uint)in_stack_fffffffffffffeac >> 0x10);
  l2rPattern._M_elems[3]._data[1] = (short)in_stack_ffffffffffffff28;
  l2rPattern._M_elems[3]._data[2] = (short)((ulong)in_stack_ffffffffffffff28 >> 0x10);
  l2rPattern._M_elems[3]._data[3] = (short)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  l2rPattern._M_elems[3]._data[4] = (short)((ulong)in_stack_ffffffffffffff28 >> 0x30);
  l2rPattern._M_elems[4]._data[0] = (short)in_stack_ffffffffffffff30;
  l2rPattern._M_elems[4]._data[1] = (short)((ulong)in_stack_ffffffffffffff30 >> 0x10);
  l2rPattern._M_elems[4]._data[2] = (short)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  l2rPattern._M_elems[4]._data[3] = (short)((ulong)in_stack_ffffffffffffff30 >> 0x30);
  l2rPattern._M_elems[4]._data[4] = (short)in_stack_ffffffffffffff38;
  l2rPattern._M_elems[5]._data[0] = (short)((ulong)in_stack_ffffffffffffff38 >> 0x10);
  l2rPattern._M_elems[5]._data[1] = (short)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  l2rPattern._M_elems[5]._data[2] = (short)((ulong)in_stack_ffffffffffffff38 >> 0x30);
  l2rPattern._M_elems[5]._data[3] = (short)in_stack_ffffffffffffff40;
  l2rPattern._M_elems[5]._data[4] = (short)((ulong)in_stack_ffffffffffffff40 >> 0x10);
  l2rPattern._M_elems[6]._data[0] = (short)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  l2rPattern._M_elems[6]._data[1] = (short)((ulong)in_stack_ffffffffffffff40 >> 0x30);
  l2rPattern._M_elems[6]._data[2] = (short)in_stack_ffffffffffffff48;
  l2rPattern._M_elems[6]._data[3] = (short)((ulong)in_stack_ffffffffffffff48 >> 0x10);
  l2rPattern._M_elems[6]._data[4] = (short)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  l2rPattern._M_elems[7]._data[0] = (short)((ulong)in_stack_ffffffffffffff48 >> 0x30);
  l2rPattern._M_elems[7]._data[1] = (short)in_stack_ffffffffffffff50;
  l2rPattern._M_elems[7]._data[2] = (short)((ulong)in_stack_ffffffffffffff50 >> 0x10);
  l2rPattern._M_elems[7]._data[3] = (short)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  l2rPattern._M_elems[7]._data[4] = (short)((ulong)in_stack_ffffffffffffff50 >> 0x30);
  l2rPattern._M_elems._88_8_ = uStack_a0;
  l2rPattern._M_elems[9]._data._6_4_ = local_98;
  r2lPattern._M_elems._8_8_ = local_88;
  r2lPattern._M_elems[0]._data._0_8_ = uStack_90;
  r2lPattern._M_elems._16_8_ = uStack_80;
  r2lPattern._M_elems[2]._data._4_4_ = local_78;
  r2lPattern._M_elems._28_11_ = in_stack_ffffffffffffff14;
  r2lPattern._M_elems[3]._data[4]._1_1_ = bVar1;
  r2lPattern._M_elems[4]._data[0] = (short)in_RDI;
  r2lPattern._M_elems[4]._data[1] = (short)((ulong)in_RDI >> 0x10);
  r2lPattern._M_elems[4]._data[2] = (short)((ulong)in_RDI >> 0x20);
  r2lPattern._M_elems[4]._data[3] = (short)((ulong)in_RDI >> 0x30);
  r2lPattern._M_elems[4]._data[4] = (short)in_stack_ffffffffffffff28;
  r2lPattern._M_elems[5]._data[0] = (short)((ulong)in_stack_ffffffffffffff28 >> 0x10);
  r2lPattern._M_elems[5]._data[1] = (short)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  r2lPattern._M_elems[5]._data[2] = (short)((ulong)in_stack_ffffffffffffff28 >> 0x30);
  r2lPattern._M_elems[5]._data[3] = (short)in_stack_ffffffffffffff30;
  r2lPattern._M_elems[5]._data[4] = (short)((ulong)in_stack_ffffffffffffff30 >> 0x10);
  r2lPattern._M_elems[6]._data[0] = (short)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  r2lPattern._M_elems[6]._data[1] = (short)((ulong)in_stack_ffffffffffffff30 >> 0x30);
  r2lPattern._M_elems[6]._data[2] = (short)in_stack_ffffffffffffff38;
  r2lPattern._M_elems[6]._data[3] = (short)((ulong)in_stack_ffffffffffffff38 >> 0x10);
  r2lPattern._M_elems[6]._data[4] = (short)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  r2lPattern._M_elems[7]._data[0] = (short)((ulong)in_stack_ffffffffffffff38 >> 0x30);
  r2lPattern._M_elems[7]._data[1] = (short)in_stack_ffffffffffffff40;
  r2lPattern._M_elems[7]._data[2] = (short)((ulong)in_stack_ffffffffffffff40 >> 0x10);
  r2lPattern._M_elems[7]._data[3] = (short)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  r2lPattern._M_elems[7]._data[4] = (short)((ulong)in_stack_ffffffffffffff40 >> 0x30);
  r2lPattern._M_elems[8]._data[0] = (short)in_stack_ffffffffffffff48;
  r2lPattern._M_elems[8]._data[1] = (short)((ulong)in_stack_ffffffffffffff48 >> 0x10);
  r2lPattern._M_elems[8]._data[2] = (short)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  r2lPattern._M_elems[8]._data[3] = (short)((ulong)in_stack_ffffffffffffff48 >> 0x30);
  r2lPattern._M_elems[8]._data[4] = (short)in_stack_ffffffffffffff50;
  r2lPattern._M_elems[9]._data[0] = (short)((ulong)in_stack_ffffffffffffff50 >> 0x10);
  r2lPattern._M_elems[9]._data[1] = (short)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  r2lPattern._M_elems[9]._data[2] = (short)((ulong)in_stack_ffffffffffffff50 >> 0x30);
  r2lPattern._M_elems[9]._data[3] = (short)in_stack_ffffffffffffff58;
  r2lPattern._M_elems[9]._data[4] = (short)((uint)in_stack_ffffffffffffff58 >> 0x10);
  iVar2 = DataBar::ParseFinderPattern<std::array<ZXing::FixedPattern<5,15,false>,10ul>>
                    (pPStack_38,bStack_39,l2rPattern,r2lPattern);
  return iVar2;
}

Assistant:

int ParseFinderPattern(const PatternView& view, bool reversed)
{
	static constexpr std::array<FixedPattern<5, 15>, 10> FINDER_PATTERNS = {{
		{3, 8, 2, 1, 1},
		{3, 5, 5, 1, 1},
		{3, 3, 7, 1, 1},
		{3, 1, 9, 1, 1},
		{2, 7, 4, 1, 1},
		{2, 5, 6, 1, 1},
		{2, 3, 8, 1, 1},
		{1, 5, 7, 1, 1},
		{1, 3, 9, 1, 1},
	}};

	// TODO: c++20 constexpr inversion from FIND_PATTERN?
	static constexpr std::array<FixedPattern<5, 15>, 10> REVERSED_FINDER_PATTERNS = {{
		{1, 1, 2, 8, 3}, {1, 1, 5, 5, 3}, {1, 1, 7, 3, 3}, {1, 1, 9, 1, 3}, {1, 1, 4, 7, 2},
		{1, 1, 6, 5, 2}, {1, 1, 8, 3, 2}, {1, 1, 7, 5, 1}, {1, 1, 9, 3, 1},
	}};

	return ParseFinderPattern(view, reversed, FINDER_PATTERNS, REVERSED_FINDER_PATTERNS);
}